

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_strcasecmp(char *s1,char *s2)

{
  byte *pbVar1;
  int iVar2;
  __int32_t **pp_Var3;
  long lVar4;
  
  pp_Var3 = __ctype_tolower_loc();
  lVar4 = 0;
  do {
    pbVar1 = (byte *)(s1 + lVar4);
    iVar2 = (*pp_Var3)[*pbVar1] - (*pp_Var3)[(byte)s2[lVar4]];
    if (iVar2 != 0) {
      return iVar2;
    }
    lVar4 = lVar4 + 1;
  } while (*pbVar1 != 0);
  return 0;
}

Assistant:

static int arg_strcasecmp(const char * s1, const char * s2) {
	const unsigned char * us1 = (const unsigned char *)s1;
	const unsigned char * us2 = (const unsigned char *)s2;

	while (tolower(*us1) == tolower(*us2++))
		if (*us1++ == '\0') {
			return 0;
		}

	return tolower(*us1) - tolower(*--us2);
}